

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O2

void Gia_ManQuantDupConeSupp_rec
               (Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vCis,Vec_Int_t *vObjs,
               _func_int_void_ptr_int *pFuncCiToKeep,void *pData)

{
  Vec_Int_t *p_00;
  int i;
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  
  i = Gia_ObjId(p,pObj);
  p_00 = &p->vCopies;
  iVar1 = Vec_IntEntry(p_00,i);
  if (-1 < iVar1) {
    return;
  }
  uVar2 = (uint)*(undefined8 *)pObj;
  if ((~uVar2 & 0x9fffffff) == 0) {
    iVar1 = Gia_ManAppendCi(pNew);
    iVar3 = Abc_Lit2Var(iVar1);
    pObj_00 = Gia_ManObj(pNew,iVar3);
    Gia_ManQuantSetSuppZero(pNew);
    iVar3 = Gia_ObjCioId(pObj);
    iVar3 = (*pFuncCiToKeep)(pData,iVar3);
    vObjs = vCis;
    if (iVar3 == 0) {
      Gia_ManQuantSetSuppCi(pNew,pObj_00);
    }
  }
  else {
    if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                    ,0xdb,
                    "void Gia_ManQuantDupConeSupp_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *, int (*)(void *, int), void *)"
                   );
    }
    Gia_ManQuantDupConeSupp_rec
              (pNew,p,pObj + -(ulong)(uVar2 & 0x1fffffff),vCis,vObjs,pFuncCiToKeep,pData);
    Gia_ManQuantDupConeSupp_rec
              (pNew,p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vCis,vObjs,
               pFuncCiToKeep,pData);
    iVar1 = Vec_IntEntry(p_00,i - (*(uint *)pObj & 0x1fffffff));
    iVar3 = Vec_IntEntry(p_00,i - (*(uint *)&pObj->field_0x4 & 0x1fffffff));
    iVar1 = Abc_LitNotCond(iVar1,*(uint *)pObj >> 0x1d & 1);
    iVar3 = Abc_LitNotCond(iVar3,(uint)((ulong)*(undefined8 *)pObj >> 0x3d) & 1);
    iVar1 = Gia_ManHashAnd(pNew,iVar1,iVar3);
  }
  Vec_IntWriteEntry(p_00,i,iVar1);
  Vec_IntPush(vObjs,i);
  return;
}

Assistant:

void Gia_ManQuantDupConeSupp_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vCis, Vec_Int_t * vObjs, int(*pFuncCiToKeep)(void *, int), void * pData )
{
    int iLit0, iLit1, iObj = Gia_ObjId( p, pObj );
    int iLit = Gia_ObjCopyArray( p, iObj );
    if ( iLit >= 0 )
        return;
    if ( Gia_ObjIsCi(pObj) )
    {
        int iLit = Gia_ManAppendCi( pNew );
        Gia_Obj_t * pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(iLit) );
        Gia_ManQuantSetSuppZero( pNew );
        if ( !pFuncCiToKeep( pData, Gia_ObjCioId(pObj) ) )
        {
            //printf( "Collecting CI %d\n", Gia_ObjCioId(pObj)+1 );
            Gia_ManQuantSetSuppCi( pNew, pObjNew );
        }
        Gia_ObjSetCopyArray( p, iObj, iLit );
        Vec_IntPush( vCis, iObj );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManQuantDupConeSupp_rec( pNew, p, Gia_ObjFanin0(pObj), vCis, vObjs, pFuncCiToKeep, pData );
    Gia_ManQuantDupConeSupp_rec( pNew, p, Gia_ObjFanin1(pObj), vCis, vObjs, pFuncCiToKeep, pData );
    iLit0 = Gia_ObjCopyArray( p, Gia_ObjFaninId0(pObj, iObj) );
    iLit1 = Gia_ObjCopyArray( p, Gia_ObjFaninId1(pObj, iObj) );
    iLit0 = Abc_LitNotCond( iLit0, Gia_ObjFaninC0(pObj) );
    iLit1 = Abc_LitNotCond( iLit1, Gia_ObjFaninC1(pObj) );
    iLit  = Gia_ManHashAnd( pNew, iLit0, iLit1 );
    Gia_ObjSetCopyArray( p, iObj, iLit );
    Vec_IntPush( vObjs, iObj );
}